

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_free(ptls_t *tls)

{
  st_ptls_key_schedule_t *__ptr;
  st_ptls_aead_context_t *psVar1;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var2;
  st_ptls_early_data_receiver_t *psVar3;
  
  ptls_buffer__release_memory(&(tls->recvbuf).rec);
  (tls->recvbuf).rec.off = 0;
  *(undefined8 *)&(tls->recvbuf).rec.is_allocated = 0;
  (tls->recvbuf).rec.base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  ptls_buffer__release_memory(&(tls->recvbuf).mess);
  (tls->recvbuf).mess.off = 0;
  *(undefined8 *)&(tls->recvbuf).mess.is_allocated = 0;
  (tls->recvbuf).mess.base = (uint8_t *)0x0;
  (tls->recvbuf).mess.capacity = 0;
  __ptr = tls->key_schedule;
  if (__ptr != (st_ptls_key_schedule_t *)0x0) {
    (*__ptr->msghash->final)(__ptr->msghash,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    free(__ptr);
  }
  psVar1 = (tls->traffic_protection).dec.aead;
  if (psVar1 != (st_ptls_aead_context_t *)0x0) {
    (*psVar1->dispose_crypto)(psVar1);
    (*ptls_clear_memory)(psVar1->static_iv,psVar1->algo->iv_size);
    free(psVar1);
  }
  psVar1 = (tls->traffic_protection).enc.aead;
  if (psVar1 != (st_ptls_aead_context_t *)0x0) {
    (*psVar1->dispose_crypto)(psVar1);
    (*ptls_clear_memory)(psVar1->static_iv,psVar1->algo->iv_size);
    free(psVar1);
  }
  free(tls->server_name);
  p_Var2 = (tls->field_7).client.certificate_verify.cb;
  if (p_Var2 != (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
    (*p_Var2)((tls->field_7).client.certificate_verify.verify_ctx,(ptls_iovec_t)ZEXT816(0),
              (ptls_iovec_t)ZEXT816(0));
  }
  psVar3 = (tls->field_7).server.early_data;
  if (psVar3 != (st_ptls_early_data_receiver_t *)0x0) {
    (*ptls_clear_memory)(psVar3,0x40);
    free((tls->field_7).server.early_data);
  }
  (*ptls_clear_memory)(tls,0x130);
  free(tls);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    if (tls->client.certificate_verify.cb != NULL)
        tls->client.certificate_verify.cb(tls->client.certificate_verify.verify_ctx, ptls_iovec_init(NULL, 0),
                                          ptls_iovec_init(NULL, 0));
    if (tls->server.early_data != NULL) {
        ptls_clear_memory(tls->server.early_data, sizeof(*tls->server.early_data));
        free(tls->server.early_data);
    }
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}